

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty_printer.hpp
# Opt level: O2

void __thiscall trial::protocol::json::example::pretty_printer::print_value(pretty_printer *this)

{
  value vVar1;
  view_type local_18;
  
  vVar1 = basic_reader<char>::symbol(this->reader);
  if ((vVar1 & ~boolean) != begin_array) {
    local_18._M_str = (this->reader->decoder).current.view.head;
    local_18._M_len = (long)(this->reader->decoder).current.view.tail - (long)local_18._M_str;
    basic_writer<char,_16UL>::literal(this->writer,&local_18);
    return;
  }
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/example/json/pretty_printer/pretty_printer.hpp"
                ,0xca,"void trial::protocol::json::example::pretty_printer::print_value()");
}

Assistant:

void print_value()
    {
        switch (reader.symbol())
        {
        case json::token::symbol::begin_array:
        case json::token::symbol::end_array:
        case json::token::symbol::begin_object:
        case json::token::symbol::end_object:
            assert(false);
            break;

        default:
            writer.literal(reader.literal());
            break;
        }
    }